

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcStatesPartials
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,int *states1,double *matrices1,
          double *partials2,double *matrices2,int startPattern,int endPattern)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  long lVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  double *pdVar14;
  double *pdVar15;
  long lVar16;
  double *pdVar17;
  ulong uVar18;
  double *pdVar19;
  double *pdVar20;
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  int local_a8;
  int local_a4;
  long local_a0;
  double *local_98;
  
  iVar2 = this->kCategoryCount;
  if (0 < (long)iVar2) {
    uVar3 = this->kStateCount;
    uVar10 = uVar3 + 3;
    if (-1 < (int)uVar3) {
      uVar10 = uVar3;
    }
    uVar11 = uVar3 + 1;
    iVar4 = this->kPartialsPaddedStateCount;
    iVar5 = this->kPatternCount;
    iVar6 = this->kMatrixSize;
    local_a4 = iVar4 * startPattern;
    pdVar15 = matrices2 + 2;
    local_a0 = 0;
    local_a8 = 0;
    local_98 = matrices2;
    do {
      if (startPattern < endPattern) {
        pdVar14 = partials2 + local_a4;
        pdVar20 = destP + (iVar5 * (int)local_a0 + startPattern) * iVar4;
        lVar16 = (long)startPattern;
        do {
          if (0 < (int)uVar3) {
            iVar7 = states1[lVar16];
            uVar13 = 0;
            lVar12 = (long)local_a8;
            pdVar17 = local_98;
            pdVar19 = pdVar15;
            do {
              if ((int)uVar3 < 4) {
                uVar18 = 0;
                auVar21 = ZEXT816(0);
              }
              else {
                auVar21 = ZEXT816(0);
                uVar18 = 0;
                do {
                  auVar21 = vfmadd231pd_fma(auVar21,*(undefined1 (*) [16])(pdVar19 + (uVar18 - 2)),
                                            *(undefined1 (*) [16])(pdVar14 + uVar18));
                  auVar21 = vfmadd231pd_fma(auVar21,*(undefined1 (*) [16])(pdVar19 + uVar18),
                                            *(undefined1 (*) [16])(pdVar14 + uVar18 + 2));
                  uVar18 = uVar18 + 4;
                } while ((long)uVar18 < (long)(int)(uVar10 & 0xfffffffc));
              }
              dVar22 = auVar21._0_8_;
              if ((int)uVar18 < (int)uVar3) {
                uVar18 = uVar18 & 0xffffffff;
                auVar8 = auVar21;
                do {
                  auVar23._8_8_ = 0;
                  auVar23._0_8_ = pdVar17[uVar18];
                  auVar1._8_8_ = 0;
                  auVar1._0_8_ = pdVar14[uVar18];
                  auVar8 = vfmadd231sd_fma(auVar8,auVar23,auVar1);
                  dVar22 = auVar8._0_8_;
                  uVar18 = uVar18 + 1;
                } while (uVar3 != uVar18);
              }
              auVar21 = vshufpd_avx(auVar21,auVar21,1);
              lVar9 = iVar7 + lVar12;
              lVar12 = lVar12 + (int)uVar11;
              *pdVar20 = (auVar21._0_8_ + dVar22) * matrices1[lVar9];
              pdVar20 = pdVar20 + 1;
              uVar13 = uVar13 + 1;
              pdVar19 = pdVar19 + uVar11;
              pdVar17 = pdVar17 + uVar11;
            } while (uVar13 != uVar3);
          }
          lVar16 = lVar16 + 1;
          pdVar14 = pdVar14 + iVar4;
        } while (lVar16 != endPattern);
      }
      local_a0 = local_a0 + 1;
      local_a8 = local_a8 + iVar6;
      local_a4 = local_a4 + iVar5 * iVar4;
      pdVar15 = pdVar15 + iVar6;
      local_98 = local_98 + iVar6;
    } while (local_a0 != iVar2);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcStatesPartials(REALTYPE* destP,
                                                           const int* states1,
                                                           const REALTYPE* matrices1,
                                                           const REALTYPE* partials2,
                                                           const REALTYPE* matrices2,
                                                           int startPattern,
                                                           int endPattern) {

    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;


    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {
            int w = l * kMatrixSize;
            int state1 = states1[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE tmp = matrices1[w + state1];
                REALTYPE sumA = 0.0;
                REALTYPE sumB = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sumA += matrices2Ptr[j + 0] * partials2Ptr[j + 0];
                    sumB += matrices2Ptr[j + 1] * partials2Ptr[j + 1];
                    sumA += matrices2Ptr[j + 2] * partials2Ptr[j + 2];
                    sumB += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }
                for (; j < kStateCount; j++) {
                    sumA += matrices2Ptr[j] * partials2Ptr[j];
                }

                w += matrixIncr;

                *(destPtr++) = tmp * (sumA + sumB);
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    *(destPtr++) = 0.0;
                }
            }
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}